

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

size_t __thiscall cppforth::Forth::RestoreInput(Forth *this)

{
  pointer psVar1;
  
  psVar1 = (this->savedInput).
           super__Vector_base<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar1 != (this->savedInput).
                super__Vector_base<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    restoreInput(this,psVar1 + -1,true,true);
    psVar1 = (this->savedInput).
             super__Vector_base<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->savedInput).
    super__Vector_base<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar1 + -1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&psVar1[-1].inputBufferStrings_);
  }
  return ((long)(this->savedInput).
                super__Vector_base<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->savedInput).
                super__Vector_base<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
}

Assistant:

size_t RestoreInput(){
			auto size = savedInput.size();
			if (size > 0){
				struct structSavedInput &save{ savedInput.at(size-1)};
				restoreInput(save,true,true);
				savedInput.pop_back();
			}
			return savedInput.size();
		}